

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_to_mac(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_ptr pTVar2;
  uintptr_t o;
  TCGv_i32 arg;
  uint val;
  TCGTemp *local_38;
  TCGv_i32 local_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = insn >> 9 & 3;
  ret = tcg_ctx->cpu_macc[val];
  arg = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (arg != tcg_ctx->NULL_QREG) {
    uVar1 = s->env->macsr;
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 0x40) == 0) {
        tcg_gen_extu_i32_i64_m68k(tcg_ctx,ret,arg);
      }
      else {
        tcg_gen_ext_i32_i64_m68k(tcg_ctx,ret,arg);
      }
    }
    else {
      tcg_gen_ext_i32_i64_m68k(tcg_ctx,ret,arg);
      tcg_gen_shli_i64_m68k(tcg_ctx,ret,ret,8);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_MACSR,QREG_MACSR,~(0x100 << (sbyte)val));
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_MACSR,QREG_MACSR,-0x10);
    pTVar2 = tcg_ctx->cpu_env;
    local_30 = tcg_const_i32_m68k(tcg_ctx,val);
    local_30 = local_30 + (long)tcg_ctx;
    local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_mac_set_flags_m68k,(TCGTemp *)0x0,2,&local_38);
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(to_mac)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 acc;
    TCGv val;
    int accnum;
    accnum = (insn >> 9) & 3;
    acc = MACREG(accnum);
    SRC_EA(env, val, OS_LONG, 0, NULL);
    if (s->env->macsr & MACSR_FI) {
        tcg_gen_ext_i32_i64(tcg_ctx, acc, val);
        tcg_gen_shli_i64(tcg_ctx, acc, acc, 8);
    } else if (s->env->macsr & MACSR_SU) {
        tcg_gen_ext_i32_i64(tcg_ctx, acc, val);
    } else {
        tcg_gen_extu_i32_i64(tcg_ctx, acc, val);
    }
    tcg_gen_andi_i32(tcg_ctx, QREG_MACSR, QREG_MACSR, ~(MACSR_PAV0 << accnum));
    gen_mac_clear_flags(tcg_ctx);
    gen_helper_mac_set_flags(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, accnum));
}